

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O3

parser_error parse_monster_plural(parser *p)

{
  _Bool _Var1;
  void *pvVar2;
  char *pcVar3;
  parser_error pVar4;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    pVar4 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    _Var1 = parser_hasval(p,"plural");
    pVar4 = PARSE_ERROR_NONE;
    if (_Var1) {
      pcVar3 = parser_getstr(p,"plural");
      pVar4 = PARSE_ERROR_NONE;
      if (*pcVar3 == '\0') {
        pcVar3 = (char *)0x0;
      }
      else {
        pcVar3 = string_make(pcVar3);
      }
      *(char **)((long)pvVar2 + 0x20) = pcVar3;
    }
  }
  return pVar4;
}

Assistant:

static enum parser_error parse_monster_plural(struct parser *p)
{
	struct monster_race *r = parser_priv(p);

	if (r == NULL)
		return PARSE_ERROR_MISSING_RECORD_HEADER;

	if (parser_hasval(p, "plural")) {
		const char *plural = parser_getstr(p, "plural");

		if (strlen(plural) > 0)
			r->plural = string_make(plural);
		else
			r->plural = NULL;
	}

	return PARSE_ERROR_NONE;
}